

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.h
# Opt level: O2

double __thiscall
imrt::Plan::incremental_eval(Plan *this,Station *station,int i,int j,double intensity)

{
  mapped_type *pmVar1;
  double dVar2;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  _List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_40;
  key_type local_28;
  value_type local_20;
  
  local_40._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_40;
  local_40._M_impl._M_node._M_size = 0;
  local_28.second = j;
  local_28.first = i;
  local_40._M_impl._M_node.super__List_node_base._M_prev =
       local_40._M_impl._M_node.super__List_node_base._M_next;
  pmVar1 = std::
           map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
           ::operator[](&station->pos2beam,&local_28);
  local_20.first = *pmVar1;
  local_20.second = intensity;
  std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::push_back
            ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_40,
             &local_20);
  dVar2 = incremental_eval(this,station,
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )&local_40);
  std::__cxx11::_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
  _M_clear(&local_40);
  return dVar2;
}

Assistant:

double incremental_eval (Station& station, int i, int j, double intensity){
		list< pair< int, double > > diff;
		diff.push_back(make_pair(station.pos2beam[make_pair(i,j)],intensity));
		return incremental_eval (station, diff);
	}